

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPrintVisitor.cpp
# Opt level: O0

CPrintVisitor * __thiscall CPrintVisitor::ConstructLabel(CPrintVisitor *this,string *label,int id)

{
  int in_ECX;
  undefined4 in_register_00000014;
  __cxx11 local_a8 [32];
  string local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [40];
  undefined8 uStack_20;
  int id_local;
  string *label_local;
  CPrintVisitor *this_local;
  
  uStack_20 = CONCAT44(in_register_00000014,id);
  label_local = label;
  this_local = this;
  std::__cxx11::to_string(local_a8,in_ECX);
  std::operator+((char *)local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"\t");
  std::operator+(local_68,(char *)local_88);
  std::operator+(local_48,local_68);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (char *)local_48);
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string((string *)local_a8);
  return this;
}

Assistant:

std::string CPrintVisitor::ConstructLabel(std::string label, int id) {
	return "\t" + std::to_string(id) + "[label=\"" + label + "\"]\n";
}